

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O2

void __thiscall CatalogReader::CatalogReader(CatalogReader *this,AbstractMajor *major)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)&this->resourcesPath,"resources/courses",&local_29);
  std::__cxx11::string::string((string *)&this->resourceExtension,".txt",&local_2a);
  std::__cxx11::string::string
            ((string *)&this->beginDebugString,"|-- START --- CATALOGREADER --- DEBUG --|",&local_2b
            );
  std::__cxx11::string::string
            ((string *)&this->endDebugString,"|---------------------------------------|",&local_2c);
  this->major = major;
  this->debugOn = false;
  return;
}

Assistant:

CatalogReader(AbstractMajor* major) {
			this->major = major;
			this->debugOn = false;
		}